

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

void __thiscall QAccessibleToolButton::actionNames(QAccessibleToolButton *this)

{
  long in_RSI;
  
  actionNames((QStringList *)this,(QAccessibleToolButton *)(in_RSI + -0x10));
  return;
}

Assistant:

QStringList QAccessibleToolButton::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
#if QT_CONFIG(menu)
        if (toolButton()->menu())
            names << showMenuAction();
        if (toolButton()->popupMode() != QToolButton::InstantPopup)
            names << QAccessibleButton::actionNames();
#endif
    }
    return names;
}